

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutils.c
# Opt level: O0

int dbuf_write(DynBuf *s,size_t offset,uint8_t *data,size_t len)

{
  int iVar1;
  DynBuf *in_RCX;
  void *in_RDX;
  long in_RSI;
  long *in_RDI;
  size_t end;
  size_t new_size;
  int local_4;
  
  new_size = (long)&in_RCX->buf + in_RSI;
  iVar1 = dbuf_realloc(in_RCX,new_size);
  if (iVar1 == 0) {
    memcpy((void *)(*in_RDI + in_RSI),in_RDX,(size_t)in_RCX);
    if ((ulong)in_RDI[1] < new_size) {
      in_RDI[1] = new_size;
    }
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int dbuf_write(DynBuf *s, size_t offset, const uint8_t *data, size_t len)
{
    size_t end;
    end = offset + len;
    if (dbuf_realloc(s, end))
        return -1;
    memcpy(s->buf + offset, data, len);
    if (end > s->size)
        s->size = end;
    return 0;
}